

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_preprocessor.c
# Opt level: O3

int MOJOSHADER_internal_include_open
              (MOJOSHADER_includeType inctype,char *fname,char *parent,char **outdata,uint *outbytes
              ,MOJOSHADER_malloc m,MOJOSHADER_free f,void *d)

{
  int iVar1;
  char *__buf;
  size_t sVar2;
  int iVar3;
  stat local_c0;
  
  iVar1 = stat(fname,&local_c0);
  iVar3 = 0;
  if (iVar1 != -1) {
    __buf = (char *)(*m)((uint)local_c0.st_size,d);
    iVar3 = 0;
    if (__buf != (char *)0x0) {
      iVar3 = 0;
      iVar1 = open(fname,0);
      if (iVar1 == -1) {
        (*f)(__buf,d);
      }
      else {
        sVar2 = read(iVar1,__buf,local_c0.st_size);
        if (sVar2 == local_c0.st_size) {
          close(iVar1);
          *outdata = __buf;
          *outbytes = (uint)local_c0.st_size;
          iVar3 = 1;
        }
        else {
          (*f)(__buf,d);
          close(iVar1);
          iVar3 = 0;
        }
      }
    }
  }
  return iVar3;
}

Assistant:

int MOJOSHADER_internal_include_open(MOJOSHADER_includeType inctype,
                                     const char *fname, const char *parent,
                                     const char **outdata,
                                     unsigned int *outbytes,
                                     MOJOSHADER_malloc m, MOJOSHADER_free f,
                                     void *d)
{
#ifdef _MSC_VER
    WCHAR wpath[MAX_PATH];
    if (!MultiByteToWideChar(CP_UTF8, 0, fname, -1, wpath, MAX_PATH))
        return 0;

    const DWORD share = FILE_SHARE_READ | FILE_SHARE_WRITE | FILE_SHARE_DELETE;
    const HANDLE handle = CreateFileW(wpath, FILE_GENERIC_READ, share,
                                      NULL, OPEN_EXISTING, NULL, NULL);
    if (handle == INVALID_HANDLE_VALUE)
        return 0;

    const DWORD fileSize = GetFileSize(handle, NULL);
    if (fileSize == INVALID_FILE_SIZE)
    {
        CloseHandle(handle);
        return 0;
    } // if

    char *data = (char *) m(fileSize, d);
    if (data == NULL)
    {
        CloseHandle(handle);
        return 0;
    } // if

    DWORD readLength = 0;
    if (!ReadFile(handle, data, fileSize, &readLength, NULL))
    {
        CloseHandle(handle);
        f(data, d);
        return 0;
    } // if

    CloseHandle(handle);

    if (readLength != fileSize)
    {
        f(data, d);
        return 0;
    } // if
    *outdata = data;
    *outbytes = fileSize;
    return 1;
#else
    struct stat statbuf;
    if (stat(fname, &statbuf) == -1)
        return 0;
    char *data = (char *) m(statbuf.st_size, d);
    if (data == NULL)
        return 0;
    const int fd = open(fname, O_RDONLY);
    if (fd == -1)
    {
        f(data, d);
        return 0;
    } // if
    if (read(fd, data, statbuf.st_size) != statbuf.st_size)
    {
        f(data, d);
        close(fd);
        return 0;
    } // if
    close(fd);
    *outdata = data;
    *outbytes = (unsigned int) statbuf.st_size;
    return 1;
#endif
}